

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setstropt(char **charp,char *s)

{
  char *pcVar1;
  char *s_local;
  char **charp_local;
  
  if (*charp != (char *)0x0) {
    (*Curl_cfree)(*charp);
    *charp = (char *)0x0;
  }
  if (s != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(s);
    if (pcVar1 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *charp = pcVar1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setstropt(char **charp, char *s)
{
  /* Release the previous storage at `charp' and replace by a dynamic storage
     copy of `s'. Return CURLE_OK or CURLE_OUT_OF_MEMORY. */

  Curl_safefree(*charp);

  if(s) {
    s = strdup(s);

    if(!s)
      return CURLE_OUT_OF_MEMORY;

    *charp = s;
  }

  return CURLE_OK;
}